

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean
HTS_Model_load(HTS_Model *model,HTS_File *pdf,HTS_File *tree,size_t vector_length,size_t num_windows
              ,HTS_Boolean is_msd)

{
  size_t *psVar1;
  HTS_Question **ppHVar2;
  HTS_Tree **ppHVar3;
  HTS_Question *pHVar4;
  size_t *psVar5;
  bool bVar6;
  bool bVar7;
  HTS_Boolean HVar8;
  int iVar9;
  uint uVar10;
  HTS_Node *pHVar11;
  HTS_Node *tree_00;
  char *pcVar12;
  char *pcVar13;
  undefined8 *puVar14;
  _HTS_Node *p_Var15;
  size_t sVar16;
  void *pvVar17;
  ulong uVar18;
  float **ppfVar19;
  float *pfVar20;
  size_t sVar21;
  _HTS_Tree **pp_Var22;
  ulong uVar23;
  undefined8 *puVar24;
  HTS_Node *pHVar25;
  _HTS_Question *p_Var26;
  ulong uVar27;
  _HTS_Node *p_Var28;
  HTS_Node *pHVar29;
  HTS_Node **ppHVar30;
  ulong uVar31;
  HTS_Node *local_880;
  uint local_838 [256];
  char local_438 [1032];
  
  if ((num_windows == 0 || vector_length == 0) ||
      (pdf == (HTS_File *)0x0 || model == (HTS_Model *)0x0)) {
    return '\0';
  }
  HTS_Model_clear(model);
  psVar1 = &model->ntree;
  if (tree == (HTS_File *)0x0) {
LAB_0010828a:
    sVar16 = 1;
    *psVar1 = 1;
  }
  else {
    model->ntree = 0;
    ppHVar2 = &model->question;
    ppHVar3 = &model->tree;
    pHVar29 = (HTS_Node *)0x0;
    pHVar11 = (HTS_Node *)0x0;
LAB_00107e97:
    iVar9 = HTS_feof(tree);
    if (iVar9 == 0) {
      HTS_get_pattern_token(tree,local_438);
      iVar9 = bcmp(local_438,"QS",3);
      if (iVar9 != 0) goto LAB_00107f18;
      tree_00 = (HTS_Node *)HTS_calloc(1,0x18);
      *(undefined8 *)tree_00 = 0;
      tree_00->pdf = 0;
      tree_00->yes = (_HTS_Node *)0x0;
      HVar8 = HTS_Question_load((HTS_Question *)tree_00,tree);
      if (HVar8 != '\0') {
        ppHVar30 = &((HTS_Tree *)pHVar29)->root;
        if (*ppHVar2 == (HTS_Question *)0x0) {
          ppHVar30 = (HTS_Node **)ppHVar2;
        }
        *ppHVar30 = tree_00;
        tree_00->yes = (_HTS_Node *)0x0;
        pHVar29 = tree_00;
        goto LAB_00107f18;
      }
      goto LAB_0010847e;
    }
    if (*ppHVar3 == (HTS_Tree *)0x0) goto LAB_0010828a;
    sVar16 = *psVar1;
    if (sVar16 == 0) {
      HTS_error(1,"HTS_Model_load_pdf: File for pdfs is not specified.\n");
      goto LAB_0010848b;
    }
  }
  model->vector_length = vector_length;
  model->num_windows = num_windows;
  model->is_msd = is_msd;
  pvVar17 = HTS_calloc(sVar16,8);
  model->npdf = (size_t *)((long)pvVar17 + -0x10);
  uVar31 = 2;
  while( true ) {
    sVar16 = *psVar1;
    uVar27 = sVar16 + 1;
    if (uVar27 < uVar31) break;
    sVar16 = HTS_fread_little_endian(local_838,4,1,pdf);
    if (sVar16 != 1) {
      sVar16 = *psVar1;
      bVar7 = false;
      bVar6 = false;
      uVar18 = sVar16 + 1;
      goto LAB_00108307;
    }
    model->npdf[uVar31] = (ulong)local_838[0];
    uVar31 = uVar31 + 1;
  }
  bVar7 = true;
  bVar6 = true;
  uVar18 = uVar27;
LAB_00108307:
  for (uVar23 = 2; uVar23 <= uVar18; uVar23 = uVar23 + 1) {
    if (model->npdf[uVar23] == 0) {
      HTS_error(1,"HTS_Model_load_pdf: # of pdfs at %d-th state should be positive.\n");
      goto LAB_00108402;
    }
  }
  if (uVar27 < uVar31) {
    pvVar17 = HTS_calloc(sVar16,8);
    model->pdf = (float ***)((long)pvVar17 + -0x10);
    sVar16 = (ulong)(is_msd != '\0') + model->vector_length * model->num_windows * 2;
    for (uVar31 = 2; uVar31 <= *psVar1 + 1; uVar31 = uVar31 + 1) {
      ppfVar19 = (float **)HTS_calloc(model->npdf[uVar31],8);
      model->pdf[uVar31] = ppfVar19;
      model->pdf[uVar31] = model->pdf[uVar31] + -1;
      for (uVar27 = 1; uVar27 <= model->npdf[uVar31]; uVar27 = uVar27 + 1) {
        pfVar20 = (float *)HTS_calloc(sVar16,4);
        model->pdf[uVar31][uVar27] = pfVar20;
        sVar21 = HTS_fread_little_endian(model->pdf[uVar31][uVar27],4,sVar16,pdf);
        bVar6 = bVar7;
        if (sVar21 != sVar16) {
          bVar6 = false;
        }
        bVar7 = bVar6;
      }
    }
    if (bVar6) {
      return '\x01';
    }
LAB_00108483:
    HTS_Model_clear(model);
  }
  else {
LAB_00108402:
    psVar5 = model->npdf;
    model->npdf = psVar5 + 2;
    free(psVar5 + 2);
    model->vector_length = 0;
    model->num_windows = 0;
    model->is_msd = '\0';
    model->pdf = (float ***)0x0;
    model->tree = (HTS_Tree *)0x0;
    *psVar1 = 0;
    model->npdf = (size_t *)0x0;
    model->question = (HTS_Question *)0x0;
  }
LAB_0010848b:
  HTS_Model_clear(model);
  return '\0';
LAB_00107f18:
  pcVar12 = strchr(local_438,0x5b);
  if (pcVar12 != (char *)0x0) {
    pcVar13 = strchr(pcVar12 + 1,0x5d);
    if ((pcVar13 != (char *)0x0) && (iVar9 = atoi(pcVar12 + 1), iVar9 != 0)) {
      tree_00 = (HTS_Node *)HTS_calloc(1,0x20);
      tree_00->pdf = 0;
      tree_00->yes = (HTS_Node *)0x0;
      tree_00->no = (_HTS_Node *)(long)iVar9;
      *(undefined8 *)tree_00 = 0;
      pcVar12 = strchr(local_438,0x7b);
      if (pcVar12 != (char *)0x0) {
        pcVar13 = pcVar12 + 2;
        if (pcVar12[1] != '(') {
          pcVar13 = pcVar12 + 1;
        }
        pcVar12 = strrchr(pcVar13,0x7d);
        if ((pcVar13 < pcVar12) && (pcVar12[-1] == ')')) {
          pcVar12 = pcVar12 + -1;
        }
        *pcVar12 = ',';
        puVar24 = (undefined8 *)0x0;
        while (pcVar12 = strchr(pcVar13,0x2c), pcVar12 != (char *)0x0) {
          puVar14 = (undefined8 *)HTS_calloc(1,0x10);
          pHVar25 = (HTS_Node *)(puVar24 + 1);
          if (*(long *)tree_00 == 0) {
            pHVar25 = tree_00;
          }
          *(undefined8 **)pHVar25 = puVar14;
          *pcVar12 = '\0';
          pcVar13 = HTS_strdup(pcVar13);
          *puVar14 = pcVar13;
          puVar14[1] = 0;
          pcVar13 = pcVar12 + 1;
          puVar24 = puVar14;
        }
      }
      pHVar4 = *ppHVar2;
      HVar8 = HTS_get_pattern_token(tree,(char *)local_838);
      if (HVar8 == '\0') {
LAB_0010846e:
        HTS_Tree_clear((HTS_Tree *)tree_00);
LAB_0010847e:
        free(tree_00);
        goto LAB_00108483;
      }
      local_880 = (HTS_Node *)HTS_calloc(1,0x30);
      local_880->index = 0;
      local_880->pdf = 0;
      local_880->yes = (_HTS_Node *)0x0;
      local_880->quest = (HTS_Question *)0x0;
      local_880->no = (_HTS_Node *)0x0;
      local_880->next = (_HTS_Node *)0x0;
      tree_00->yes = local_880;
      if ((short)local_838[0] == 0x7b) {
        while ((HVar8 = HTS_get_pattern_token(tree,(char *)local_838), HVar8 == '\x01' &&
               ((short)local_838[0] != 0x7d))) {
          uVar10 = atoi((char *)local_838);
          p_Var28 = local_880;
          while( true ) {
            if (p_Var28 == (HTS_Node *)0x0) {
              HTS_error(0,"HTS_Tree_load: Cannot find node %d.\n",(ulong)uVar10);
              goto LAB_0010846e;
            }
            if (p_Var28->index == uVar10) break;
            p_Var28 = p_Var28->next;
          }
          HVar8 = HTS_get_pattern_token(tree,(char *)local_838);
          p_Var26 = pHVar4;
          if (HVar8 == '\0') goto LAB_0010846e;
          while( true ) {
            if (p_Var26 == (HTS_Question *)0x0) {
              p_Var28->quest = (HTS_Question *)0x0;
              HTS_error(0,"HTS_Tree_load: Cannot find question %s.\n",local_838);
              goto LAB_0010846e;
            }
            iVar9 = strcmp((char *)local_838,p_Var26->string);
            if (iVar9 == 0) break;
            p_Var26 = p_Var26->next;
          }
          p_Var28->quest = p_Var26;
          p_Var15 = (_HTS_Node *)HTS_calloc(1,0x30);
          p_Var28->yes = p_Var15;
          p_Var15 = (_HTS_Node *)HTS_calloc(1,0x30);
          p_Var28->no = p_Var15;
          p_Var15 = p_Var28->yes;
          p_Var15->index = 0;
          p_Var15->pdf = 0;
          p_Var15->yes = (_HTS_Node *)0x0;
          p_Var15->no = (_HTS_Node *)0x0;
          p_Var15->next = (_HTS_Node *)0x0;
          p_Var15->quest = (HTS_Question *)0x0;
          p_Var15 = p_Var28->no;
          p_Var15->index = 0;
          p_Var15->no = (_HTS_Node *)0x0;
          p_Var15->next = (_HTS_Node *)0x0;
          p_Var15->pdf = 0;
          p_Var15->yes = (_HTS_Node *)0x0;
          p_Var15->quest = (HTS_Question *)0x0;
          HVar8 = HTS_get_pattern_token(tree,(char *)local_838);
          if (HVar8 == '\0') {
            p_Var28->quest = (HTS_Question *)0x0;
            free(p_Var28->yes);
            free(p_Var28->no);
            goto LAB_0010846e;
          }
          HVar8 = HTS_is_num((char *)local_838);
          if (HVar8 == '\0') {
            sVar16 = HTS_name2num((char *)local_838);
            p_Var15 = p_Var28->no;
            p_Var15->pdf = sVar16;
          }
          else {
            iVar9 = atoi((char *)local_838);
            p_Var15 = p_Var28->no;
            p_Var15->index = iVar9;
          }
          p_Var15->next = local_880;
          HVar8 = HTS_get_pattern_token(tree,(char *)local_838);
          if (HVar8 == '\0') {
            p_Var28->quest = (HTS_Question *)0x0;
            free(p_Var28->yes);
            free(p_Var28->no);
            goto LAB_0010846e;
          }
          HVar8 = HTS_is_num((char *)local_838);
          if (HVar8 == '\0') {
            sVar16 = HTS_name2num((char *)local_838);
            local_880 = p_Var28->yes;
            local_880->pdf = sVar16;
          }
          else {
            iVar9 = atoi((char *)local_838);
            local_880 = p_Var28->yes;
            local_880->index = iVar9;
          }
          local_880->next = p_Var15;
        }
      }
      else {
        sVar16 = HTS_name2num((char *)local_838);
        local_880->pdf = sVar16;
      }
      pp_Var22 = (_HTS_Tree **)&pHVar11->pdf;
      if (*ppHVar3 == (HTS_Tree *)0x0) {
        pp_Var22 = ppHVar3;
      }
      *pp_Var22 = (_HTS_Tree *)tree_00;
      tree_00->pdf = 0;
      *psVar1 = *psVar1 + 1;
      pHVar11 = tree_00;
    }
  }
  goto LAB_00107e97;
}

Assistant:

static HTS_Boolean HTS_Model_load(HTS_Model * model, HTS_File * pdf, HTS_File * tree, size_t vector_length, size_t num_windows, HTS_Boolean is_msd)
{
   /* check */
   if (model == NULL || pdf == NULL || vector_length == 0 || num_windows == 0)
      return FALSE;

   /* reset */
   HTS_Model_clear(model);

   /* load tree */
   if (HTS_Model_load_tree(model, tree) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   /* load pdf */
   if (HTS_Model_load_pdf(model, pdf, vector_length, num_windows, is_msd) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   return TRUE;
}